

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,list *mat)

{
  int iVar1;
  long lVar2;
  element_t *peVar3;
  PyObject *pPVar4;
  size_t sVar5;
  logic_error *this_00;
  ulong uVar6;
  int iVar7;
  rvalue_from_python_stage1_data rVar8;
  int local_98;
  int local_94;
  object_base local_90;
  long *local_88;
  object_base local_80;
  rvalue_from_python_stage1_data local_78;
  PyObject local_68;
  object_base local_58;
  object_base local_50;
  PyObject *local_48;
  list *local_40;
  size_t local_38;
  
  (this->super_base_matrix<double>).format__ = fixed;
  (this->super_base_matrix<double>).fractional_digits__ = 6;
  local_68.ob_type =
       (PyTypeObject *)PyObject_Size((mat->super_list_base).super_object.super_object_base.m_ptr);
  lVar2 = PyErr_Occurred();
  if (lVar2 != 0) {
    boost::python::throw_error_already_set();
  }
  if ((int)local_68.ob_type == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"can\'t create empty arrays");
LAB_0013dd87:
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_50.m_ptr = local_50.m_ptr & 0xffffffff00000000;
  local_78.convertible = boost::python::api::object_initializer_impl<false,_false>::get<int>();
  local_80.m_ptr = (mat->super_list_base).super_object.super_object_base.m_ptr;
  (local_80.m_ptr)->ob_refcnt = (local_80.m_ptr)->ob_refcnt + 1;
  lVar2 = ((PyObject *)local_78.convertible)->ob_refcnt;
  ((PyObject *)local_78.convertible)->ob_refcnt = lVar2 + 1;
  if (-1 < lVar2) {
    ((PyObject *)local_78.convertible)->ob_refcnt = lVar2;
    if (lVar2 == 0) {
      _Py_Dealloc(local_78.convertible);
    }
    boost::python::api::getitem((object *)&local_90,(object *)&local_80);
    iVar1 = PyObject_Size(local_90.m_ptr);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      boost::python::throw_error_already_set();
    }
    if (0 < (local_90.m_ptr)->ob_refcnt) {
      lVar2 = (local_90.m_ptr)->ob_refcnt + -1;
      (local_90.m_ptr)->ob_refcnt = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc();
      }
      if (0 < *(Py_ssize_t *)local_78.convertible) {
        lVar2 = *(Py_ssize_t *)local_78.convertible + -1;
        *(Py_ssize_t *)local_78.convertible = lVar2;
        if (lVar2 == 0) {
          _Py_Dealloc();
        }
        if (0 < (local_80.m_ptr)->ob_refcnt) {
          lVar2 = (local_80.m_ptr)->ob_refcnt + -1;
          (local_80.m_ptr)->ob_refcnt = lVar2;
          if (lVar2 == 0) {
            _Py_Dealloc();
          }
          iVar7 = (int)local_68.ob_type;
          this->rows__ = (long)iVar7;
          this->columns__ = (long)iVar1;
          uVar6 = (long)iVar1 * (long)iVar7;
          peVar3 = (element_t *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
          this->elements__ = peVar3;
          local_98 = 0;
          if (0 < iVar7) {
            local_40 = mat;
            do {
              local_38 = this->columns__;
              pPVar4 = boost::python::api::object_initializer_impl<false,_false>::get<int>
                                 (&local_98);
              local_78.convertible = pPVar4;
              local_80.m_ptr = (mat->super_list_base).super_object.super_object_base.m_ptr;
              (local_80.m_ptr)->ob_refcnt = (local_80.m_ptr)->ob_refcnt + 1;
              lVar2 = pPVar4->ob_refcnt;
              pPVar4->ob_refcnt = lVar2 + 1;
              if (lVar2 < 0) goto LAB_0013dd4c;
              pPVar4->ob_refcnt = lVar2;
              if (lVar2 == 0) {
                _Py_Dealloc(pPVar4);
              }
              boost::python::api::getitem((object *)&local_90,(object *)&local_80);
              sVar5 = PyObject_Size(local_90.m_ptr);
              lVar2 = PyErr_Occurred();
              if (lVar2 != 0) {
                boost::python::throw_error_already_set();
              }
              if ((local_90.m_ptr)->ob_refcnt < 1) goto LAB_0013dd4c;
              lVar2 = (local_90.m_ptr)->ob_refcnt + -1;
              (local_90.m_ptr)->ob_refcnt = lVar2;
              if (lVar2 == 0) {
                _Py_Dealloc();
              }
              if (*(Py_ssize_t *)local_78.convertible < 1) goto LAB_0013dd4c;
              lVar2 = *(Py_ssize_t *)local_78.convertible + -1;
              *(Py_ssize_t *)local_78.convertible = lVar2;
              if (lVar2 == 0) {
                _Py_Dealloc();
              }
              if ((local_80.m_ptr)->ob_refcnt < 1) goto LAB_0013dd4c;
              lVar2 = (local_80.m_ptr)->ob_refcnt + -1;
              (local_80.m_ptr)->ob_refcnt = lVar2;
              if (lVar2 == 0) {
                _Py_Dealloc();
              }
              mat = local_40;
              if (local_38 != sVar5) {
                this_00 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error
                          (this_00,"the array must have the same number of columns");
                goto LAB_0013dd87;
              }
              local_94 = 0;
              if (0 < iVar1) {
                do {
                  local_48 = boost::python::api::object_initializer_impl<false,_false>::get<int>
                                       (&local_98);
                  local_50.m_ptr = (mat->super_list_base).super_object.super_object_base.m_ptr;
                  (local_50.m_ptr)->ob_refcnt = (local_50.m_ptr)->ob_refcnt + 1;
                  lVar2 = local_48->ob_refcnt;
                  local_48->ob_refcnt = lVar2 + 1;
                  if (lVar2 < 0) goto LAB_0013dd4c;
                  local_48->ob_refcnt = lVar2;
                  if (lVar2 == 0) {
                    _Py_Dealloc(local_48);
                  }
                  boost::python::api::
                  object_operators<boost::python::api::proxy<boost::python::api::item_policies>_>::
                  operator[]<int>((object_operators<boost::python::api::proxy<boost::python::api::item_policies>_>
                                   *)&local_90,(int *)&local_50);
                  boost::python::api::getitem((object *)&local_58,(object *)&local_90);
                  local_80.m_ptr = local_58.m_ptr;
                  rVar8 = (rvalue_from_python_stage1_data)
                          boost::python::converter::rvalue_from_python_stage1
                                    (local_58.m_ptr,
                                     boost::python::converter::detail::
                                     registered_base<double_const_volatile&>::converters);
                  pPVar4 = &local_68;
                  local_78 = rVar8;
                  if ((PyObject *)rVar8.convertible != &local_68) {
                    pPVar4 = (PyObject *)
                             boost::python::converter::rvalue_from_python_stage2
                                       (local_80.m_ptr,&local_78,
                                        boost::python::converter::detail::
                                        registered_base<double_const_volatile&>::converters);
                  }
                  this->elements__[(long)local_98 * this->columns__ + (long)local_94] =
                       (element_t)pPVar4->ob_refcnt;
                  if ((local_58.m_ptr)->ob_refcnt < 1) goto LAB_0013dd4c;
                  lVar2 = (local_58.m_ptr)->ob_refcnt + -1;
                  (local_58.m_ptr)->ob_refcnt = lVar2;
                  if (lVar2 == 0) {
                    _Py_Dealloc();
                  }
                  if (*local_88 < 1) goto LAB_0013dd4c;
                  lVar2 = *local_88 + -1;
                  *local_88 = lVar2;
                  if (lVar2 == 0) {
                    _Py_Dealloc();
                  }
                  if ((local_90.m_ptr)->ob_refcnt < 1) goto LAB_0013dd4c;
                  lVar2 = (local_90.m_ptr)->ob_refcnt + -1;
                  (local_90.m_ptr)->ob_refcnt = lVar2;
                  if (lVar2 == 0) {
                    _Py_Dealloc();
                  }
                  if (local_48->ob_refcnt < 1) goto LAB_0013dd4c;
                  lVar2 = local_48->ob_refcnt + -1;
                  local_48->ob_refcnt = lVar2;
                  if (lVar2 == 0) {
                    _Py_Dealloc();
                  }
                  if ((local_50.m_ptr)->ob_refcnt < 1) goto LAB_0013dd4c;
                  lVar2 = (local_50.m_ptr)->ob_refcnt + -1;
                  (local_50.m_ptr)->ob_refcnt = lVar2;
                  if (lVar2 == 0) {
                    _Py_Dealloc();
                  }
                  local_94 = local_94 + 1;
                } while (local_94 < iVar1);
              }
              local_98 = local_98 + 1;
            } while (local_98 < (int)local_68.ob_type);
          }
          return;
        }
      }
    }
  }
LAB_0013dd4c:
  __assert_fail("Py_REFCNT(m_ptr) > 0","/usr/include/boost/python/object_core.hpp",0x1a6,
                "boost::python::api::object_base::~object_base()");
}

Assistant:

matrix(boost::python::list mat){
          int len_row = boost::python::len(mat);
          if (len_row == 0)
              throw logic_error("can't create empty arrays");
          int len_col = boost::python::len(mat[0]);

          rows__ = len_row;
          columns__ = len_col;
          elements__ = new element_t[rows__ * columns__];

          for (int i = 0; i < len_row; i++) {

              if (columns__ != boost::python::len(mat[i]))
                  throw logic_error("the array must have the same number of columns");

              for (int j = 0; j < len_col; j++) {
                  elements__[offset__(i,j)] = boost::python::extract<element_t>(mat[i][j]);
              }
          }

      }